

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O3

string * cmCMakePresetsGraph::GetUserFilename(string *__return_storage_ptr__,string *sourceDir)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  undefined8 local_18;
  char *local_10;
  
  local_28._M_str = (sourceDir->_M_dataplus)._M_p;
  local_28._M_len = sourceDir->_M_string_length;
  local_18 = 0x16;
  local_10 = "/CMakeUserPresets.json";
  views._M_len = 2;
  views._M_array = &local_28;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCMakePresetsGraph::GetUserFilename(const std::string& sourceDir)
{
  return cmStrCat(sourceDir, "/CMakeUserPresets.json");
}